

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O3

void __thiscall
FConsoleBuffer::AddText(FConsoleBuffer *this,int printlevel,char *text,FILE *logfile)

{
  uint *puVar1;
  size_t tailLen;
  EAddType EVar2;
  uint uVar3;
  FConsoleBuffer *this_00;
  FString build;
  FString FStack_28;
  
  FString::FString(&FStack_28,"\x1cB");
  if (this->mAddType == APPENDLINE) {
    TArray<FString,_FString>::Pop(&this->mConsoleText,&FStack_28);
    this->mLastLineNeedsUpdate = true;
  }
  else {
    if (this->mAddType == REPLACELINE) {
      uVar3 = (this->mConsoleText).Count;
      if (uVar3 != 0) {
        uVar3 = uVar3 - 1;
        (this->mConsoleText).Count = uVar3;
        FString::~FString((this->mConsoleText).Array + uVar3);
      }
      this->mLastLineNeedsUpdate = true;
    }
    if (printlevel != 2 && -1 < printlevel) {
      if (printlevel == 200) {
        FString::operator=(&FStack_28,"\x1cD");
      }
      else if ((uint)printlevel < 5) {
        FString::Format(&FStack_28,"%c%c",0x1c,(ulong)(uint)PrintColors[(uint)printlevel]);
      }
    }
  }
  tailLen = strlen(text);
  if (text[tailLen - 1] == '\n') {
    tailLen = tailLen - 1;
    EVar2 = NEWLINE;
  }
  else if (text[tailLen - 1] == '\r') {
    tailLen = tailLen - 1;
    EVar2 = REPLACELINE;
  }
  else {
    EVar2 = APPENDLINE;
  }
  this->mAddType = EVar2;
  FString::AppendCStrPart(&FStack_28,text,tailLen);
  TArray<FString,_FString>::Grow(&this->mConsoleText,1);
  this_00 = (FConsoleBuffer *)((this->mConsoleText).Array + (this->mConsoleText).Count);
  FString::AttachToOther((FString *)this_00,&FStack_28);
  puVar1 = &(this->mConsoleText).Count;
  *puVar1 = *puVar1 + 1;
  if (logfile != (FILE *)0x0) {
    WriteLineToLog(this_00,logfile,text);
  }
  FString::~FString(&FStack_28);
  return;
}

Assistant:

void FConsoleBuffer::AddText(int printlevel, const char *text, FILE *logfile)
{
	FString build = TEXTCOLOR_TAN;
	
	if (mAddType == REPLACELINE)
	{
		// Just wondering: Do we actually need this case? If so, it may need some work.
		mConsoleText.Pop();	// remove the line to be replaced
		mLastLineNeedsUpdate = true;
	}
	else if (mAddType == APPENDLINE)
	{
		mConsoleText.Pop(build);
		printlevel = -1;
		mLastLineNeedsUpdate = true;
	}
	
	if (printlevel >= 0 && printlevel != PRINT_HIGH)
	{
		if (printlevel == 200) build = TEXTCOLOR_GREEN;
		else if (printlevel < PRINTLEVELS) build.Format("%c%c", TEXTCOLOR_ESCAPE, PrintColors[printlevel]);
	}
	
	size_t textsize = strlen(text);
	
	if (text[textsize-1] == '\r')
	{
		textsize--;
		mAddType = REPLACELINE;
	}
	else if (text[textsize-1] == '\n')
	{
		textsize--;
		mAddType = NEWLINE;
	}
	else
	{
		mAddType = APPENDLINE;
	}

	// don't bother about linefeeds etc. inside the text, we'll let the formatter sort this out later.
	build.AppendCStrPart(text, textsize);
	mConsoleText.Push(build);
	if (logfile != NULL) WriteLineToLog(logfile, text);
}